

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::CommittedShaderResources::Set
          (CommittedShaderResources *this,Uint32 Index,ShaderResourceBindingImplType *pSRB)

{
  __int_type_conflict1 _Var1;
  byte bVar2;
  char (*in_RCX) [32];
  byte bVar3;
  ShaderResourceCacheVk *pSVar4;
  string msg;
  string local_48;
  
  if (7 < Index) {
    FormatString<char[26],char[32]>
              (&local_48,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x6ccdb5,in_RCX);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"Set",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x182);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  pSVar4 = &(pSRB->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).
            m_ShaderResourceCache;
  if (pSRB == (ShaderResourceBindingImplType *)0x0) {
    pSVar4 = (ShaderResourceCacheVk *)0x0;
  }
  (this->ResourceCaches)._M_elems[Index] = pSVar4;
  bVar3 = (byte)(1 << ((byte)Index & 0x1f));
  bVar2 = this->StaleSRBMask | bVar3;
  if (pSRB == (ShaderResourceBindingImplType *)0x0) {
    bVar2 = ~bVar3 & this->StaleSRBMask;
  }
  this->StaleSRBMask = bVar2;
  if ((pSRB == (ShaderResourceBindingImplType *)0x0) || (pSVar4->m_NumDynamicBuffers == 0)) {
    this->DynamicSRBMask = this->DynamicSRBMask & ~bVar3;
  }
  else {
    this->DynamicSRBMask = this->DynamicSRBMask | bVar3;
  }
  RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::operator=
            ((this->SRBs)._M_elems + Index,pSRB);
  if (pSRB == (ShaderResourceBindingImplType *)0x0) {
    _Var1 = 0;
  }
  else {
    this->ResourcesValidated = false;
    _Var1 = (pSVar4->super_ShaderResourceCacheBase).m_DvpRevision.super___atomic_base<unsigned_int>.
            _M_i;
  }
  (this->CacheRevisions)._M_elems[Index] = _Var1;
  return;
}

Assistant:

void Set(Uint32 Index, ShaderResourceBindingImplType* pSRB)
        {
            VERIFY_EXPR(Index < MAX_RESOURCE_SIGNATURES);
            ShaderResourceCacheImplType* pResourceCache = pSRB != nullptr ? &pSRB->GetResourceCache() : nullptr;
            ResourceCaches[Index]                       = pResourceCache;

            const SRBMaskType SRBBit = static_cast<SRBMaskType>(1u << Index);
            if (pResourceCache != nullptr)
                StaleSRBMask |= SRBBit;
            else
                StaleSRBMask &= ~SRBBit;

            if (pResourceCache != nullptr && pResourceCache->HasDynamicResources())
                DynamicSRBMask |= SRBBit;
            else
                DynamicSRBMask &= ~SRBBit;

#ifdef DILIGENT_DEVELOPMENT
            SRBs[Index] = pSRB;
            if (pSRB != nullptr)
                ResourcesValidated = false;
            CacheRevisions[Index] = pResourceCache != nullptr ? pResourceCache->DvpGetRevision() : 0;
#endif
        }